

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_bary4(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  REF_GLOB *pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  REF_DBL volume;
  REF_DBL local_40;
  double local_38;
  undefined8 uStack_30;
  
  iVar8 = *nodes;
  if (((-1 < (long)iVar8) && (iVar1 = ref_node->max, iVar8 < iVar1)) &&
     (pRVar4 = ref_node->global, -1 < pRVar4[iVar8])) {
    uVar6 = nodes[1];
    if (((int)uVar6 < iVar1 && -1 < (int)uVar6) && (-1 < pRVar4[uVar6])) {
      uVar2 = nodes[2];
      if (((int)uVar2 < iVar1 && -1 < (int)uVar2) && (-1 < pRVar4[uVar2])) {
        uVar3 = nodes[3];
        if (((int)uVar3 < iVar1 && -1 < (int)uVar3) && (-1 < pRVar4[uVar3])) {
          pRVar5 = ref_node->real;
          uVar9 = (ulong)(uVar6 * 0xf);
          uVar10 = (ulong)(uVar2 * 0xf);
          uVar12 = (ulong)(uVar3 * 0xf);
          dVar17 = pRVar5[uVar12];
          dVar16 = pRVar5[uVar12 + 1];
          dVar18 = pRVar5[uVar12 + 2];
          dVar13 = ((pRVar5[uVar9] - dVar17) * (pRVar5[uVar10 + 1] - dVar16) -
                   (pRVar5[uVar10] - dVar17) * (pRVar5[uVar9 + 1] - dVar16)) * (xyz[2] - dVar18) +
                   (((pRVar5[uVar9 + 1] - dVar16) * (pRVar5[uVar10 + 2] - dVar18) -
                    (pRVar5[uVar9 + 2] - dVar18) * (pRVar5[uVar10 + 1] - dVar16)) * (*xyz - dVar17)
                   - ((pRVar5[uVar10 + 2] - dVar18) * (pRVar5[uVar9] - dVar17) -
                     (pRVar5[uVar9 + 2] - dVar18) * (pRVar5[uVar10] - dVar17)) * (xyz[1] - dVar16));
          *bary = dVar13;
          uVar11 = (ulong)(uint)(iVar8 * 0xf);
          dVar17 = pRVar5[uVar12];
          dVar16 = pRVar5[uVar12 + 1];
          dVar18 = pRVar5[uVar12 + 2];
          dVar14 = ((*xyz - dVar17) * (pRVar5[uVar10 + 1] - dVar16) -
                   (pRVar5[uVar10] - dVar17) * (xyz[1] - dVar16)) * (pRVar5[uVar11 + 2] - dVar18) +
                   (((xyz[1] - dVar16) * (pRVar5[uVar10 + 2] - dVar18) -
                    (xyz[2] - dVar18) * (pRVar5[uVar10 + 1] - dVar16)) * (pRVar5[uVar11] - dVar17) -
                   ((pRVar5[uVar10 + 2] - dVar18) * (*xyz - dVar17) -
                   (xyz[2] - dVar18) * (pRVar5[uVar10] - dVar17)) * (pRVar5[uVar11 + 1] - dVar16));
          bary[1] = dVar14;
          dVar17 = pRVar5[uVar12];
          dVar16 = pRVar5[uVar12 + 1];
          dVar18 = pRVar5[uVar12 + 2];
          dVar15 = ((pRVar5[uVar9] - dVar17) * (xyz[1] - dVar16) -
                   (*xyz - dVar17) * (pRVar5[uVar9 + 1] - dVar16)) * (pRVar5[uVar11 + 2] - dVar18) +
                   (((pRVar5[uVar9 + 1] - dVar16) * (xyz[2] - dVar18) -
                    (pRVar5[uVar9 + 2] - dVar18) * (xyz[1] - dVar16)) * (pRVar5[uVar11] - dVar17) -
                   ((xyz[2] - dVar18) * (pRVar5[uVar9] - dVar17) -
                   (pRVar5[uVar9 + 2] - dVar18) * (*xyz - dVar17)) * (pRVar5[uVar11 + 1] - dVar16));
          bary[2] = dVar15;
          dVar17 = *xyz;
          dVar16 = xyz[1];
          dVar18 = xyz[2];
          dVar16 = ((pRVar5[uVar9] - dVar17) * (pRVar5[uVar10 + 1] - dVar16) -
                   (pRVar5[uVar10] - dVar17) * (pRVar5[uVar9 + 1] - dVar16)) *
                   (pRVar5[uVar11 + 2] - dVar18) +
                   (((pRVar5[uVar9 + 1] - dVar16) * (pRVar5[uVar10 + 2] - dVar18) -
                    (pRVar5[uVar9 + 2] - dVar18) * (pRVar5[uVar10 + 1] - dVar16)) *
                    (pRVar5[uVar11] - dVar17) -
                   ((pRVar5[uVar10 + 2] - dVar18) * (pRVar5[uVar9] - dVar17) -
                   (pRVar5[uVar9 + 2] - dVar18) * (pRVar5[uVar10] - dVar17)) *
                   (pRVar5[uVar11 + 1] - dVar16));
          bary[3] = dVar16;
          local_38 = dVar13 + dVar14 + dVar15 + dVar16;
          uStack_30 = 0;
          dVar17 = local_38 * 1e+20;
          if (dVar17 <= -dVar17) {
            dVar17 = -dVar17;
          }
          dVar18 = dVar13;
          if (dVar13 <= -dVar13) {
            dVar18 = -dVar13;
          }
          if (dVar18 < dVar17) {
            dVar18 = dVar14;
            if (dVar14 <= -dVar14) {
              dVar18 = -dVar14;
            }
            if (dVar18 < dVar17) {
              dVar18 = dVar15;
              if (dVar15 <= -dVar15) {
                dVar18 = -dVar15;
              }
              if (dVar18 < dVar17) {
                dVar18 = dVar16;
                if (dVar16 <= -dVar16) {
                  dVar18 = -dVar16;
                }
                if (dVar18 < dVar17) {
                  *bary = dVar13 / local_38;
                  bary[1] = dVar14 / local_38;
                  bary[2] = dVar15 / local_38;
                  bary[3] = dVar16 / local_38;
                  return 0;
                }
              }
            }
          }
          uVar6 = ref_node_tet_vol(ref_node,nodes,&local_40);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xb6b,"ref_node_bary4",(ulong)uVar6,"bary vol chk");
            return uVar6;
          }
          printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",local_38,*bary,
                 bary[1],bary[2],bary[3],
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xb6d);
          iVar8 = 0;
          lVar7 = 1;
          do {
            iVar1 = (int)lVar7;
            if (bary[iVar8] < bary[lVar7] || bary[iVar8] == bary[lVar7]) {
              iVar1 = iVar8;
            }
            iVar8 = iVar1;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          bary[2] = 0.0;
          bary[3] = 0.0;
          *bary = 0.0;
          bary[1] = 0.0;
          bary[iVar8] = -1.0;
          uVar6 = ref_node_tet_vol(ref_node,nodes,&local_40);
          if (uVar6 == 0) {
            printf("vol %.18e modified bary\n%.18e %.18e\n%.18e %.18e\n",local_40,*bary,bary[1],
                   bary[2],bary[3]);
            return 4;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xb75,"ref_node_bary4",(ulong)uVar6,"bary vol chk");
          return uVar6;
        }
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xb2f,
         "ref_node_bary4",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary4(REF_NODE ref_node, REF_INT *nodes,
                                  REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL total, m11, m12, m13;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]) ||
      !ref_node_valid(ref_node, nodes[3]))
    RSS(REF_INVALID, "node invalid");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  a = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[0] = (m11 - m12 + m13);
  a = ref_node_xyz_ptr(ref_node, nodes[0]);

  b = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[1] = (m11 - m12 + m13);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);

  c = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[2] = (m11 - m12 + m13);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);

  d = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[3] = (m11 - m12 + m13);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  total = bary[0] + bary[1] + bary[2] + bary[3];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total) &&
      ref_math_divisible(bary[3], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    bary[3] /= total;
  } else {
    REF_DBL volume;
    REF_INT i, smallest;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "bary vol chk");
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2],
           bary[3]);
    /* for walking set the smallest as the direction */
    smallest = 0;
    for (i = 1; i < 4; i++)
      if (bary[i] < bary[smallest]) smallest = i;
    for (i = 0; i < 4; i++) bary[i] = 0.0;
    bary[smallest] = -1.0;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "bary vol chk");
    printf("vol %.18e modified bary\n%.18e %.18e\n%.18e %.18e\n", volume,
           bary[0], bary[1], bary[2], bary[3]);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}